

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intrusive_list.cpp
# Opt level: O0

void __thiscall IntrusiveList_Empty_Test::TestBody(IntrusiveList_Empty_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_70;
  Message local_68;
  value *local_60;
  iterator local_48;
  difference_type local_40;
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  intrusive_list<(anonymous_namespace)::value> v;
  IntrusiveList_Empty_Test *this_local;
  
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::intrusive_list
            ((intrusive_list<(anonymous_namespace)::value> *)&gtest_ar.message_);
  local_34 = 0;
  local_48 = pstore::broker::intrusive_list<(anonymous_namespace)::value>::begin
                       ((intrusive_list<(anonymous_namespace)::value> *)&gtest_ar.message_);
  local_60 = (value *)pstore::broker::intrusive_list<(anonymous_namespace)::value>::end
                                ((intrusive_list<(anonymous_namespace)::value> *)&gtest_ar.message_)
  ;
  local_40 = std::distance<pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator>
                       (local_48,(iterator)local_60);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_30,"0","std::distance (v.begin (), v.end ())",&local_34,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
               ,0x22,message);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::value> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST (IntrusiveList, Empty) {
    pstore::broker::intrusive_list<value> v;
    EXPECT_EQ (0, std::distance (v.begin (), v.end ()));
}